

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,int,double,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,false,true>
               (double *ldata,int *rdata,double *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  double dVar1;
  int iVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar2 = *rdata;
      dVar5 = (double)iVar2;
      iVar13 = 0;
      do {
        dVar1 = ldata[iVar13];
        if (iVar2 < 0) {
          dVar6 = pow(10.0,-dVar5);
          dVar7 = round(dVar1 / dVar6);
          dVar7 = dVar7 * dVar6;
          uVar14 = 0;
          uVar15 = 0;
        }
        else {
          dVar6 = pow(10.0,dVar5);
          dVar7 = round(dVar1 * dVar6);
          uVar14 = SUB84(dVar1,0);
          uVar15 = (undefined4)((ulong)dVar1 >> 0x20);
          dVar7 = dVar7 / dVar6;
        }
        dVar1 = (double)CONCAT44(uVar15,uVar14);
        if ((ulong)ABS(dVar7) < 0x7ff0000000000000) {
          dVar1 = dVar7;
        }
        result_data[iVar13] = dVar1;
        iVar13 = iVar13 + 1;
      } while (count != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar11 = 0;
    do {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar12 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar12 = count;
        }
LAB_00fe7a20:
        uVar8 = uVar9;
        if (uVar9 < uVar12) {
          iVar2 = *rdata;
          dVar5 = (double)iVar2;
          uVar4 = (ulong)DAT_013261c0;
          do {
            dVar1 = ldata[uVar9];
            if (iVar2 < 0) {
              dVar6 = pow(10.0,(double)((ulong)dVar5 ^ uVar4));
              dVar7 = round(dVar1 / dVar6);
              dVar7 = dVar7 * dVar6;
              uVar14 = 0;
              uVar15 = 0;
            }
            else {
              dVar6 = pow(10.0,dVar5);
              dVar7 = round(dVar1 * dVar6);
              uVar14 = SUB84(dVar1,0);
              uVar15 = (undefined4)((ulong)dVar1 >> 0x20);
              dVar7 = dVar7 / dVar6;
            }
            dVar1 = (double)CONCAT44(uVar15,uVar14);
            if ((ulong)ABS(dVar7) < 0x7ff0000000000000) {
              dVar1 = dVar7;
            }
            result_data[uVar9] = dVar1;
            uVar9 = uVar9 + 1;
            uVar8 = uVar12;
          } while (uVar12 != uVar9);
        }
      }
      else {
        uVar4 = puVar3[uVar11];
        uVar12 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar12 = count;
        }
        uVar8 = uVar12;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_00fe7a20;
          uVar8 = uVar9;
          if (uVar9 < uVar12) {
            uVar10 = 0;
            do {
              if ((uVar4 >> (uVar10 & 0x3f) & 1) != 0) {
                dVar5 = ldata[uVar9 + uVar10];
                dVar1 = (double)*rdata;
                if (*rdata < 0) {
                  dVar7 = pow(10.0,-dVar1);
                  dVar1 = round(dVar5 / dVar7);
                  dVar1 = dVar1 * dVar7;
                  uVar14 = 0;
                  uVar15 = 0;
                }
                else {
                  dVar7 = pow(10.0,dVar1);
                  dVar1 = round(dVar5 * dVar7);
                  uVar14 = SUB84(dVar5,0);
                  uVar15 = (undefined4)((ulong)dVar5 >> 0x20);
                  dVar1 = dVar1 / dVar7;
                }
                dVar5 = (double)CONCAT44(uVar15,uVar14);
                if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
                  dVar5 = dVar1;
                }
                result_data[uVar9 + uVar10] = dVar5;
              }
              uVar10 = uVar10 + 1;
              uVar8 = uVar12;
            } while (uVar12 - uVar9 != uVar10);
          }
        }
      }
      uVar9 = uVar8;
      uVar11 = uVar11 + 1;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}